

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  JSShape *sh;
  JSValue new_target;
  JSValue new_target_00;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  JSValue method;
  bool bVar4;
  int iVar5;
  JSRefCountHeader *p_1;
  JSValueUnion JVar6;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  JSRefCountHeader *p;
  int64_t iVar12;
  ulong unaff_R13;
  int64_t iVar13;
  JSRefCountHeader *p_2;
  ulong idx;
  JSValue func_obj;
  JSValue enum_obj;
  JSValue enum_obj_00;
  JSValue func_obj_00;
  JSValue v;
  JSValue v_00;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValue JVar18;
  JSValue this_obj;
  JSValue prop;
  JSValue method_00;
  JSValue this_obj_00;
  JSValue prop_00;
  JSValue val;
  int64_t len;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar22;
  ulong local_d8;
  void *local_d0;
  ulong local_c8;
  JSValueUnion local_b8;
  int64_t iStack_b0;
  int64_t local_a8;
  uint local_98;
  undefined4 uStack_94;
  int64_t local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  int64_t local_60;
  ulong local_58;
  undefined8 local_50;
  int64_t local_40;
  JSValueUnion local_38;
  
  JVar17.tag = iStack_b0;
  JVar17.u.float64 = local_b8.float64;
  piVar1 = *(int **)&(argv->u).int32;
  iVar12 = argv->tag;
  JVar16 = *argv;
  JVar14 = *argv;
  JVar15 = *argv;
  local_88 = 0;
  iVar13 = 3;
  local_80 = 3;
  local_78.int32 = 0;
  local_70 = 3;
  bVar4 = true;
  if (argc < 2) {
    local_d8 = 0;
    uVar10 = 0;
    local_a8 = 3;
    local_d0 = (void *)0x0;
    local_c8 = 3;
  }
  else {
    local_d0 = argv[1].u.ptr;
    local_a8 = argv[1].tag;
    local_c8 = (ulong)local_d0 >> 0x20;
    bVar4 = true;
    if ((int)local_a8 != 3) {
      unaff_R13 = (ulong)(uint)argc;
      iVar5 = check_function(ctx,argv[1]);
      if (iVar5 != 0) {
        JVar15.tag = 6;
        uVar10 = 0;
        goto LAB_00164650;
      }
      if (argc != 2) {
        iVar13 = argv[2].tag;
        uVar10 = (ulong)argv[2].u.ptr & 0xffffffff00000000;
        local_d8 = (ulong)argv[2].u.ptr & 0xffffffff;
        bVar4 = false;
        goto LAB_00163f44;
      }
      bVar4 = false;
    }
    local_d8 = 0;
    uVar10 = 0;
  }
LAB_00163f44:
  uVar19 = 0;
  JVar14 = JS_GetPropertyInternal(ctx,JVar15,0xc6,JVar14,0);
  uVar9 = (uint)JVar14.tag;
  if (uVar9 == 3) {
    local_90 = iVar13;
    JVar16 = JS_ToObject(ctx,JVar16);
    JVar15.tag = 6;
    if (((int)JVar16.tag != 6) &&
       (iVar5 = js_get_length64(ctx,(int64_t *)&local_98,JVar16), -1 < iVar5)) {
      uVar11 = CONCAT44(uStack_94,local_98);
      JVar7._4_4_ = 0;
      JVar7.int32 = local_98;
      local_68.float64 = (double)(long)uVar11;
      if ((long)(int)local_98 == uVar11) {
        local_68 = JVar7;
      }
      local_60 = 7;
      if ((long)(int)local_98 == uVar11) {
        local_60 = 0;
      }
      if (((int)this_val.tag == -1) && ((*(byte *)((long)this_val.u.ptr + 5) & 0x10) != 0)) {
        JVar14 = JS_CallConstructorInternal(ctx,this_val,this_val,1,(JSValue *)&local_68,2);
      }
      else {
        JVar14 = js_array_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_68);
      }
      unaff_R13 = (ulong)JVar14.u.ptr >> 0x20;
      if ((int)JVar14.tag != 6) {
        if ((long)uVar11 < 1) {
          uVar11 = 0;
        }
        else {
          idx = 0;
          do {
            JVar15 = JS_GetPropertyInt64(ctx,JVar16,idx);
            if ((uint)JVar15.tag == 6) goto LAB_00164602;
            if (!bVar4) {
              local_58 = idx & 0xffffffff;
              local_50 = 0;
              new_target_00.tag._0_4_ = 3;
              new_target_00.u.ptr = (void *)((ulong)JVar17.u._4_4_ << 0x20);
              new_target_00.tag._4_4_ = 0;
              func_obj_00.tag = local_a8;
              func_obj_00.u.ptr = (void *)((ulong)local_d0 & 0xffffffff | local_c8 << 0x20);
              this_obj_00.tag = local_90;
              this_obj_00.u.ptr = (void *)(uVar10 | local_d8);
              _local_68 = JVar15;
              JVar17 = JS_CallInternal(ctx,func_obj_00,this_obj_00,new_target_00,2,
                                       (JSValue *)&local_68,2);
              if ((0xfffffff4 < (uint)JVar15.tag) &&
                 (iVar5 = *JVar15.u.ptr, *(int *)JVar15.u.ptr = iVar5 + -1, iVar5 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar15);
              }
              JVar15 = JVar17;
              if ((int)JVar17.tag == 6) goto LAB_00164602;
            }
            JVar8.float64 = (double)(long)idx;
            if (idx < 0x80000000) {
              JVar8.ptr = (void *)(idx & 0xffffffff);
            }
            iVar12 = 7;
            if (idx < 0x80000000) {
              iVar12 = 0;
            }
            prop_00.tag = iVar12;
            prop_00.u.float64 = JVar8.float64;
            iVar5 = JS_DefinePropertyValueValue(ctx,JVar14,prop_00,JVar15,0x4007);
            if (iVar5 < 0) goto LAB_00164602;
            idx = idx + 1;
            JVar17 = JVar15;
          } while (uVar11 != idx);
        }
LAB_001646d5:
        JVar15.tag = JVar14.tag;
        uVar9 = (uint)uVar11;
        JVar6._0_4_ = uVar9 & 0x7fffffff;
        JVar6._4_4_ = 0;
        JVar8.float64 = (double)(uVar11 & 0xffffffff);
        if (-1 < (int)uVar9) {
          JVar8 = JVar6;
        }
        iVar12 = 7;
        if (-1 < (int)uVar9) {
          iVar12 = 0;
        }
        JVar15.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | unaff_R13 << 0x20);
        val.tag = iVar12;
        val.u.float64 = JVar8.float64;
        iVar5 = JS_SetPropertyInternal(ctx,JVar15,0x30,val,0x4000);
        uVar10 = (ulong)JVar14.u.ptr & 0xffffffff;
        if (-1 < iVar5) goto LAB_0016462d;
      }
      goto LAB_00164602;
    }
    uVar10 = 0;
  }
  else {
    JVar15.tag = (ulong)uVar9;
    if (uVar9 == 6) {
      uVar10 = 0;
      goto LAB_00164650;
    }
    if ((0xfffffff4 < uVar9) &&
       (iVar5 = *JVar14.u.ptr, *(int *)JVar14.u.ptr = iVar5 + -1, iVar5 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
    if (((int)this_val.tag == -1) && ((*(byte *)((long)this_val.u.ptr + 5) & 0x10) != 0)) {
      in_stack_fffffffffffffee0 = 2;
      uVar19 = 0;
      in_stack_fffffffffffffedc = 0;
      JVar14 = JS_CallConstructorInternal(ctx,this_val,this_val,0,(JSValue *)0x0,2);
    }
    else {
      sh = ctx->array_shape;
      (sh->header).ref_count = (sh->header).ref_count + 1;
      JVar14 = JS_NewObjectFromShape(ctx,sh,2);
    }
    unaff_R13 = (ulong)JVar14.u.ptr >> 0x20;
    if ((int)JVar14.tag == 6) {
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      if (0xfffffff4 < (uint)iVar12) {
        *piVar1 = *piVar1 + 1;
      }
      local_88 = SUB84(piVar1,0);
      uStack_84 = (undefined4)((ulong)piVar1 >> 0x20);
      local_90 = iVar13;
      local_80 = iVar12;
      iVar5 = js_for_of_start(ctx,(JSValue *)&local_78,0);
      iVar12 = local_80;
      if (iVar5 == 0) {
        JVar8._4_4_ = uStack_84;
        JVar8.int32 = local_88;
        JVar16.u._4_4_ = uStack_84;
        JVar16.u.int32 = local_88;
        JVar16.tag = local_80;
        local_38._4_4_ = local_78._4_4_;
        local_38.int32 = local_78.int32;
        method.u._4_4_ = local_78._4_4_;
        method.u.int32 = local_78.int32;
        method.tag = local_70;
        local_40 = local_70;
        JVar15 = JS_IteratorNext(ctx,JVar16,method,(int)&local_98,
                                 (JSValue *)CONCAT44(in_stack_fffffffffffffedc,uVar19),
                                 (BOOL *)CONCAT44(in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0));
        if ((int)JVar15.tag != 6) {
          uVar11 = 0;
          do {
            if (local_98 != 0) {
              JVar16 = (JSValue)(ZEXT816(3) << 0x40);
              goto LAB_001646d5;
            }
            JVar16 = JVar15;
            if (!bVar4) {
              local_58 = uVar11 & 0xffffffff;
              local_50 = 0;
              new_target.tag._0_4_ = 3;
              new_target.u.ptr = (void *)((ulong)JVar17.u._4_4_ << 0x20);
              new_target.tag._4_4_ = 0;
              func_obj.tag = local_a8;
              func_obj.u.ptr = (void *)((ulong)local_d0 & 0xffffffff | local_c8 << 0x20);
              this_obj.tag = local_90;
              this_obj.u.ptr = (void *)(uVar10 | local_d8);
              _local_68 = JVar15;
              JVar16 = JS_CallInternal(ctx,func_obj,this_obj,new_target,2,(JSValue *)&local_68,2);
              if ((0xfffffff4 < (uint)JVar15.tag) &&
                 (iVar5 = *JVar15.u.ptr, *(int *)JVar15.u.ptr = iVar5 + -1, iVar5 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar15);
              }
              if ((int)JVar16.tag == 6) break;
            }
            JVar7.float64 = (double)(long)uVar11;
            if (uVar11 < 0x80000000) {
              JVar7.ptr = (void *)(uVar11 & 0xffffffff);
            }
            iVar13 = 7;
            if (uVar11 < 0x80000000) {
              iVar13 = 0;
            }
            uVar19 = JVar16.u._0_4_;
            uVar20 = JVar16.u._4_4_;
            uVar21 = (undefined4)JVar16.tag;
            uVar22 = JVar16.tag._4_4_;
            prop.tag = iVar13;
            prop.u.float64 = JVar7.float64;
            iVar5 = JS_DefinePropertyValueValue(ctx,JVar14,prop,JVar16,0x4007);
            if (iVar5 < 0) break;
            uVar11 = uVar11 + 1;
            enum_obj.tag = iVar12;
            enum_obj.u.ptr = JVar8.ptr;
            method_00.tag = local_40;
            method_00.u.float64 = local_38.float64;
            JVar15 = JS_IteratorNext(ctx,enum_obj,method_00,(int)&local_98,
                                     (JSValue *)CONCAT44(uVar20,uVar19),
                                     (BOOL *)CONCAT44(uVar22,uVar21));
            JVar17 = JVar16;
          } while ((int)JVar15.tag != 6);
        }
        if ((int)iVar12 != 3) {
          enum_obj_00.tag = iVar12;
          enum_obj_00.u.ptr = JVar8.ptr;
          JS_IteratorClose(ctx,enum_obj_00,1);
        }
        JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      }
    }
LAB_00164602:
    JVar15.tag = 6;
    uVar10 = 0;
    if (0xfffffff4 < (uint)JVar14.tag) {
      unaff_R13 = unaff_R13 << 0x20;
      JVar14.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | unaff_R13);
      iVar5 = *JVar14.u.ptr;
      *(int *)JVar14.u.ptr = iVar5 + -1;
      if (iVar5 < 2) {
        __JS_FreeValueRT(ctx->rt,JVar14);
      }
    }
  }
LAB_0016462d:
  if ((0xfffffff4 < (uint)JVar16.tag) &&
     (iVar5 = *JVar16.u.ptr, *(int *)JVar16.u.ptr = iVar5 + -1, iVar5 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar16);
  }
LAB_00164650:
  if (0xfffffff4 < (uint)local_80) {
    JVar2._4_4_ = uStack_84;
    JVar2.int32 = local_88;
    iVar5 = *JVar2.ptr;
    *(int *)JVar2.ptr = iVar5 + -1;
    if (iVar5 < 2) {
      v.tag = local_80;
      v.u.ptr = JVar2.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  if (0xfffffff4 < (uint)local_70) {
    JVar3._4_4_ = local_78._4_4_;
    JVar3.int32 = local_78.int32;
    iVar5 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar5 + -1;
    if (iVar5 < 2) {
      v_00.tag = local_70;
      v_00.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(ctx->rt,v_00);
    }
  }
  JVar18.u.ptr = (void *)(uVar10 | unaff_R13 << 0x20);
  JVar18.tag = JVar15.tag;
  return JVar18;
}

Assistant:

static JSValue js_array_from(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, r, v, v2, arrayLike;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arrayLike = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        if (JS_IsConstructor(ctx, this_val))
            r = JS_CallConstructor(ctx, this_val, 0, NULL);
        else
            r = JS_NewArray(ctx);
        if (JS_IsException(r))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception_close;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arrayLike = JS_ToObject(ctx, items);
        if (JS_IsException(arrayLike))
            goto exception;
        if (js_get_length64(ctx, &len, arrayLike) < 0)
            goto exception;
        v = JS_NewInt64(ctx, len);
        args[0] = v;
        if (JS_IsConstructor(ctx, this_val)) {
            r = JS_CallConstructor(ctx, this_val, 1, args);
        } else {
            r = js_array_constructor(ctx, JS_UNDEFINED, 1, args);
        }
        JS_FreeValue(ctx, v);
        if (JS_IsException(r))
            goto exception;
        for(k = 0; k < len; k++) {
            v = JS_GetPropertyInt64(ctx, arrayLike, k);
            if (JS_IsException(v))
                goto exception;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, r, JS_ATOM_length, JS_NewUint32(ctx, k)) < 0)
        goto exception;
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arrayLike);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}